

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_utils.h
# Opt level: O0

uint InvExtGCD<unsigned_int,BitsInt<unsigned_int,32>,32,141u>(uint x)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint in_EDI;
  long in_FS_OFFSET;
  int q;
  int newrlen;
  int rlen;
  uint newr;
  uint r;
  uint newt;
  uint t;
  int in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar6;
  undefined4 in_stack_ffffffffffffffdc;
  int local_1c;
  uint local_14;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = BitsInt<unsigned_int,_32>::IsZero(in_stack_ffffffffffffffcc);
  local_c = in_EDI;
  if ((!bVar2) &&
     (bVar2 = BitsInt<unsigned_int,_32>::IsOne(in_stack_ffffffffffffffcc), local_c = in_EDI, !bVar2)
     ) {
    local_c = 0;
    local_14 = 0x8d;
    local_1c = 0x21;
    uVar6 = in_EDI;
    iVar3 = BitsInt<unsigned_int,_32>::Bits(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    while (in_EDI != 0) {
      iVar4 = local_1c - iVar3;
      uVar5 = BitsInt<unsigned_int,_32>::Shift(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      local_14 = uVar5 ^ local_14;
      uVar5 = BitsInt<unsigned_int,_32>::UnsafeShift
                        (in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      local_c = uVar5 ^ local_c;
      local_1c = BitsInt<unsigned_int,_32>::Bits
                           (in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      if (local_14 < in_EDI) {
        BitsInt<unsigned_int,_32>::Swap
                  ((uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (uint *)0x152618b);
        BitsInt<unsigned_int,_32>::Swap
                  ((uint *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                   (uint *)0x152619a);
        std::swap<int>((int *)CONCAT44(in_stack_ffffffffffffffdc,uVar6),
                       (int *)CONCAT44(iVar4,in_stack_ffffffffffffffd0));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

inline I InvExtGCD(I x)
{
    if (F::IsZero(x) || F::IsOne(x)) return x;
    I t(0), newt(1);
    I r(MOD), newr = x;
    int rlen = BITS + 1, newrlen = F::Bits(newr, BITS);
    while (newr) {
        int q = rlen - newrlen;
        r ^= F::Shift(newr, q);
        t ^= F::UnsafeShift(newt, q);
        rlen = F::Bits(r, rlen - 1);
        if (r < newr) {
            F::Swap(t, newt);
            F::Swap(r, newr);
            std::swap(rlen, newrlen);
        }
    }
    return t;
}